

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O0

int check_vless_link(char *vless,FileName *varray,char *to_file,int *highest_p)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  char *local_1208;
  char *lf_cp2;
  char *lf_cp1;
  FileName *linked_entry;
  FileName *max_entry;
  char ver [16];
  char name [255];
  char dir [4096];
  stat sbuf;
  ino_t vless_ino;
  uint max_no;
  int found;
  int rval;
  int *highest_p_local;
  char *to_file_local;
  FileName *varray_local;
  char *vless_local;
  
  alarm(TIMEOUT_TIME);
  do {
    piVar2 = __errno_location();
    *piVar2 = 0;
    iVar1 = stat(vless,(stat *)(dir + 0xff8));
    bVar3 = false;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  alarm(0);
  if (iVar1 == 0) {
    if (sbuf.st_ino == 1) {
      *to_file = '\0';
      vless_local._4_4_ = 1;
    }
    else {
      iVar1 = unpack_filename(vless,name + 0xf8,ver + 8,(char *)&max_entry,1);
      if (iVar1 == 0) {
        vless_local._4_4_ = 0;
      }
      else {
        vless_ino._4_4_ = 0;
        bVar3 = false;
        linked_entry = (FileName *)0x0;
        lf_cp1 = (char *)0x0;
        for (to_file_local = varray->name; *(int *)(to_file_local + 0x1000) != -1;
            to_file_local = to_file_local + 0x1004) {
          if (vless_ino._4_4_ < *(uint *)(to_file_local + 0x1000)) {
            vless_ino._4_4_ = *(uint *)(to_file_local + 0x1000);
            linked_entry = (FileName *)to_file_local;
          }
          if ((!bVar3) && (*(int *)(to_file_local + 0x1000) != 0)) {
            lf_cp2 = name + 0xf8;
            for (local_1208 = name + 0xf8; *local_1208 != '\0'; local_1208 = local_1208 + 1) {
              if (*local_1208 == '/') {
                lf_cp2 = local_1208;
              }
            }
            if (lf_cp2 == local_1208 + -1) {
              if (lf_cp2 == name + 0xf8) {
                strcpy(ver + 8,"/");
                strcat(ver + 8,to_file_local);
              }
              else {
                strcpy(ver + 8,name + 0xf8);
                strcat(ver + 8,to_file_local);
              }
            }
            else {
              strcpy(ver + 8,name + 0xf8);
              strcat(ver + 8,"/");
              strcat(ver + 8,to_file_local);
            }
            alarm(TIMEOUT_TIME);
            do {
              piVar2 = __errno_location();
              *piVar2 = 0;
              iVar1 = stat(ver + 8,(stat *)(dir + 0xff8));
              bVar3 = false;
              if (iVar1 == -1) {
                piVar2 = __errno_location();
                bVar3 = *piVar2 == 4;
              }
            } while (bVar3);
            alarm(0);
            if (iVar1 != 0) {
              piVar2 = __errno_location();
              *Lisp_errno = *piVar2;
              return 0;
            }
            bVar3 = true;
            lf_cp1 = to_file_local;
          }
        }
        if (lf_cp1 == (char *)0x0) {
          *to_file = '\0';
        }
        else {
          if ((FileName *)lf_cp1 == linked_entry) {
            *highest_p = 1;
          }
          else {
            *highest_p = 0;
          }
          strcpy(to_file,ver + 8);
        }
        vless_local._4_4_ = 1;
      }
    }
  }
  else {
    piVar2 = __errno_location();
    *Lisp_errno = *piVar2;
    vless_local._4_4_ = 0;
  }
  return vless_local._4_4_;
}

Assistant:

static int check_vless_link(char *vless, FileName *varray, char *to_file, int *highest_p)
{
  int rval, found;
  unsigned max_no;
  ino_t vless_ino;
  struct stat sbuf;
  char dir[MAXPATHLEN], name[MAXNAMLEN], ver[VERSIONLEN];
  FileName *max_entry, *linked_entry;

  TIMEOUT(rval = stat(vless, &sbuf));
  if (rval != 0) {
    *Lisp_errno = errno;
    return (0);
  }

  if (sbuf.st_nlink == 1) {
    /* There is no file to which vless is hard linked. */
    *to_file = '\0';
    return (1);
  }
  vless_ino = sbuf.st_ino;

  if (unpack_filename(vless, dir, name, ver, 1) == 0) return (0);

  max_no = 0;
  found = 0;
  max_entry = NULL;
  linked_entry = NULL;

  while (varray->version_no != LASTVERSIONARRAY) {
    if (varray->version_no > max_no) {
      max_no = varray->version_no;
      max_entry = varray;
    }
    if (!found && varray->version_no != 0) {
      ConcDirAndName(dir, varray->name, name);
      TIMEOUT(rval = stat(name, &sbuf));
      if (rval != 0) {
        *Lisp_errno = errno;
        return (0);
      }
      if (sbuf.st_ino == vless_ino) {
        found = 1;
        linked_entry = varray;
      }
    }
    varray++;
  }

  if (linked_entry != NULL) {
    if (linked_entry == max_entry) {
      *highest_p = 1;
    } else {
      *highest_p = 0;
    }
    strcpy(to_file, name);
  } else {
    *to_file = '\0';
  }
  return (1);
}